

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

size_t Output::VPrint(char16 *form,__va_list_tag *argptr)

{
  int iVar1;
  size_t sVar2;
  size_t local_1020;
  size_t size;
  char16 buf [2048];
  __va_list_tag *argptr_local;
  char16 *form_local;
  
  buf._4088_8_ = argptr;
  iVar1 = _vsnwprintf_unsafe((WCHAR *)&size,0x800,0xffffffffffffffff,form,argptr);
  local_1020 = (size_t)iVar1;
  if (local_1020 == 0xffffffffffffffff) {
    local_1020 = 0x7ff;
  }
  sVar2 = PrintBuffer((char16 *)&size,local_1020);
  return sVar2;
}

Assistant:

size_t __cdecl
Output::VPrint(const char16 *form, va_list argptr)
{
    char16 buf[2048];
    size_t size;

    size = _vsnwprintf_s(buf, _countof(buf), _TRUNCATE, form, argptr);
    if(size == -1)
    {
        size = _countof(buf) - 1;  // characters written, excluding the terminating null
    }
    return Output::PrintBuffer(buf, size);
}